

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O2

Dim * __thiscall
cnn::CwiseQuotient::dim_forward
          (Dim *__return_storage_ptr__,CwiseQuotient *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  uint uVar1;
  pointer __file;
  uint uVar2;
  bool bVar3;
  ostream *os;
  invalid_argument *this_00;
  __off_t __length;
  Dim r_1;
  Dim local_1cc;
  Dim r;
  
  __file = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)__file != 0x48) {
    __assert_fail("xs.size() == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes-common.cc"
                  ,0x317,"virtual Dim cnn::CwiseQuotient::dim_forward(const vector<Dim> &) const");
  }
  Dim::truncate(__return_storage_ptr__,(char *)__file,(__off_t)xs);
  r.d._0_8_ = *(undefined8 *)__return_storage_ptr__->d;
  r.d._8_8_ = *(undefined8 *)(__return_storage_ptr__->d + 2);
  r.d._16_8_ = *(undefined8 *)(__return_storage_ptr__->d + 4);
  r._24_8_ = *(undefined8 *)(__return_storage_ptr__->d + 6);
  r.bd = 1;
  Dim::truncate(&local_1cc,
                (char *)((xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
                         super__Vector_impl_data._M_start + 1),__length);
  r_1.d[0] = local_1cc.d[0];
  r_1.d[1] = local_1cc.d[1];
  r_1.d[2] = local_1cc.d[2];
  r_1.d[3] = local_1cc.d[3];
  r_1.d[4] = local_1cc.d[4];
  r_1.d[5] = local_1cc.d[5];
  r_1.d[6] = local_1cc.d[6];
  r_1.nd = local_1cc.nd;
  r_1.bd = 1;
  bVar3 = operator!=(&r,&r_1);
  if (!bVar3) {
    uVar1 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_start[1].bd;
    uVar2 = __return_storage_ptr__->bd;
    if (__return_storage_ptr__->bd < uVar1) {
      uVar2 = uVar1;
    }
    __return_storage_ptr__->bd = uVar2;
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&r);
  os = std::operator<<((ostream *)&r,"Bad input dimensions in CwiseQuotient: ");
  operator<<(os,xs);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,(string *)&r_1);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

string LogisticSigmoid::as_string(const vector<string>& arg_names) const {
  ostringstream s;
  s << "\\sigma(" << arg_names[0] << ')';
  return s.str();
}